

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void slang::SVInt::buildDivideResult
               (SVInt *result,uint32_t *value,bitwidth_t bitWidth,bool signFlag,uint32_t numWords)

{
  long in_RSI;
  long *in_RDI;
  uint in_R8D;
  uint32_t i;
  uint64_t val;
  bool in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffb8;
  bitwidth_t in_stack_ffffffffffffffbc;
  SVInt *in_stack_ffffffffffffffc0;
  
  if (in_RDI != (long *)0x0) {
    if (in_R8D == 1) {
      SVInt(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf)
      ;
      operator=((SVInt *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                (SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      ~SVInt(in_stack_ffffffffffffffc0);
    }
    else {
      SVInt(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
            CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffaf)
      ;
      operator=((SVInt *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                (SVInt *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      ~SVInt(in_stack_ffffffffffffffc0);
      for (uVar1 = 0; uVar1 < in_R8D; uVar1 = uVar1 + 1) {
        *(ulong *)(*in_RDI + (ulong)uVar1 * 8) =
             CONCAT44(*(undefined4 *)(in_RSI + (ulong)(uVar1 * 2 + 1) * 4),
                      *(undefined4 *)(in_RSI + (ulong)(uVar1 << 1) * 4));
      }
    }
  }
  return;
}

Assistant:

void SVInt::buildDivideResult(SVInt* result, uint32_t* value, bitwidth_t bitWidth, bool signFlag,
                              uint32_t numWords) {
    if (!result)
        return;

    if (numWords == 1) {
        uint64_t val = uint64_t(value[0]) | (uint64_t(value[1]) << (BITS_PER_WORD / 2));
        *result = SVInt(bitWidth, val, signFlag);
    }
    else {
        *result = SVInt(bitWidth, 0, signFlag);
        for (uint32_t i = 0; i < numWords; i++)
            result->pVal[i] = uint64_t(value[i * 2]) |
                              (uint64_t(value[i * 2 + 1]) << (BITS_PER_WORD / 2));
    }
}